

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# av1_dx_iface.c
# Opt level: O0

aom_image_t *
add_grain_if_needed(aom_codec_alg_priv_t *ctx,aom_image_t *img,aom_image_t *grain_img,
                   aom_film_grain_t *grain_params)

{
  int iVar1;
  long lVar2;
  aom_image_t *paVar3;
  int *in_RCX;
  aom_image_t *in_RDX;
  aom_image_t *in_RSI;
  void *in_RDI;
  AllocCbParam param;
  aom_codec_frame_buffer_t *fb;
  BufferPool *pool;
  int h_even;
  int w_even;
  aom_alloc_img_data_cb_fn_t alloc_cb;
  aom_image_t *local_8;
  
  local_8 = in_RSI;
  if (*in_RCX != 0) {
    alloc_cb = *(aom_alloc_img_data_cb_fn_t *)((long)in_RDI + 0x6b10);
    lVar2 = (long)in_RDI + *(long *)((long)in_RDI + 0x6b00) * 0x18 + 0x6aa0;
    paVar3 = aom_img_alloc_with_cb
                       (in_RDX,(aom_img_fmt_t)((ulong)in_RCX >> 0x20),(uint)in_RCX,
                        in_RSI->d_w + 1 & 0xfffffffe,in_RSI->d_h + 1 & 0xfffffffe,alloc_cb,in_RDI);
    if (paVar3 == (aom_image_t *)0x0) {
      local_8 = (aom_image_t *)0x0;
    }
    else {
      in_RDX->user_priv = in_RSI->user_priv;
      in_RDX->fb_priv = *(void **)(lVar2 + 0x10);
      iVar1 = av1_add_film_grain(grain_params,_h_even,(aom_image_t *)pool);
      if (iVar1 == 0) {
        *(long *)((long)in_RDI + 0x6b00) = *(long *)((long)in_RDI + 0x6b00) + 1;
        local_8 = in_RDX;
      }
      else {
        (**(code **)(alloc_cb + 0x38))(*(undefined8 *)(alloc_cb + 0x28),lVar2);
        local_8 = (aom_image_t *)0x0;
      }
    }
  }
  return local_8;
}

Assistant:

static aom_image_t *add_grain_if_needed(aom_codec_alg_priv_t *ctx,
                                        aom_image_t *img,
                                        aom_image_t *grain_img,
                                        aom_film_grain_t *grain_params) {
  if (!grain_params->apply_grain) return img;

  const int w_even = ALIGN_POWER_OF_TWO_UNSIGNED(img->d_w, 1);
  const int h_even = ALIGN_POWER_OF_TWO_UNSIGNED(img->d_h, 1);

  BufferPool *const pool = ctx->buffer_pool;
  aom_codec_frame_buffer_t *fb =
      &ctx->grain_image_frame_buffers[ctx->num_grain_image_frame_buffers];
  AllocCbParam param;
  param.pool = pool;
  param.fb = fb;
  if (!aom_img_alloc_with_cb(grain_img, img->fmt, w_even, h_even, 16,
                             AllocWithGetFrameBufferCb, &param)) {
    return NULL;
  }

  grain_img->user_priv = img->user_priv;
  grain_img->fb_priv = fb->priv;
  if (av1_add_film_grain(grain_params, img, grain_img)) {
    pool->release_fb_cb(pool->cb_priv, fb);
    return NULL;
  }

  ctx->num_grain_image_frame_buffers++;
  return grain_img;
}